

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

void free_instruction_operand_pseudos(Proc *proc,Instruction *insn)

{
  Pseudo *pPVar1;
  Pseudo *pseudo;
  PtrListIterator operanditer__;
  PtrListIterator local_30;
  
  raviX_ptrlist_reverse_iterator(&local_30,(PtrList *)insn->operands);
  pPVar1 = (Pseudo *)raviX_ptrlist_iter_prev(&local_30);
  if (pPVar1 == (Pseudo *)0x0) {
    pseudo = (Pseudo *)0x0;
  }
  else {
    do {
      pseudo = pPVar1;
      free_temp_pseudo(proc,pseudo,false);
      pPVar1 = (Pseudo *)raviX_ptrlist_iter_prev(&local_30);
    } while (pPVar1 != (Pseudo *)0x0);
  }
  if ((pseudo != (Pseudo *)0x0) &&
     (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xc)) {
    free_temp_pseudo(proc,(pseudo->field_3).range_pseudo,false);
  }
  return;
}

Assistant:

static void free_instruction_operand_pseudos(Proc *proc, Instruction *insn)
{
	Pseudo *operand;
	Pseudo *last = NULL;
	FOR_EACH_PTR_REVERSE(insn->operands, Pseudo, operand) {
		free_temp_pseudo(proc, operand, false);
		last = operand;
	} END_FOR_EACH_PTR_REVERSE(operand)
	if (last != NULL && last->type == PSEUDO_RANGE_SELECT) {
		// free the underlying range pseudo used by range select
		free_temp_pseudo(proc, last->range_pseudo, false);
	}
}